

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

void av1_dr_prediction_z3_c
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint8_t *puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  bVar1 = (byte)upsample_left;
  lVar5 = (long)(bw + bh + -1 << (bVar1 & 0x1f));
  uVar12 = 0;
  uVar10 = 0;
  if (0 < bh) {
    uVar10 = (ulong)(uint)bh;
  }
  iVar6 = dy;
  uVar4 = (ulong)(uint)bw;
  if (bw < 1) {
    uVar4 = uVar12;
  }
  do {
    if (uVar12 == uVar4) {
      return;
    }
    uVar11 = (uint)(iVar6 << (bVar1 & 0x1f)) >> 1 & 0x1f;
    lVar9 = (long)(iVar6 >> (6 - bVar1 & 0x1f));
    uVar2 = 0;
    uVar8 = 0;
    puVar7 = dst;
    while( true ) {
      if (uVar10 == uVar8) goto LAB_00898f30;
      if (lVar5 <= lVar9) break;
      *puVar7 = (uint8_t)(left[lVar9 + 1] * uVar11 + (uint)left[lVar9] * (0x20 - uVar11) + 0x10 >> 5
                         );
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + (1 << (bVar1 & 0x1f));
      puVar7 = puVar7 + stride;
      uVar2 = uVar2 + 1;
    }
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < bh) {
      uVar3 = (ulong)(uint)bh;
    }
    for (; uVar8 != uVar3; uVar3 = uVar3 - 1) {
      *puVar7 = left[lVar5];
      puVar7 = puVar7 + stride;
    }
LAB_00898f30:
    uVar12 = uVar12 + 1;
    dst = dst + 1;
    iVar6 = iVar6 + dy;
  } while( true );
}

Assistant:

void av1_dr_prediction_z3_c(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                            const uint8_t *above, const uint8_t *left,
                            int upsample_left, int dx, int dy) {
  int r, c, y, base, shift, val;

  (void)above;
  (void)dx;

  assert(dx == 1);
  assert(dy > 0);

  const int max_base_y = (bw + bh - 1) << upsample_left;
  const int frac_bits = 6 - upsample_left;
  const int base_inc = 1 << upsample_left;
  y = dy;
  for (c = 0; c < bw; ++c, y += dy) {
    base = y >> frac_bits;
    shift = ((y << upsample_left) & 0x3F) >> 1;

    for (r = 0; r < bh; ++r, base += base_inc) {
      if (base < max_base_y) {
        val = left[base] * (32 - shift) + left[base + 1] * shift;
        dst[r * stride + c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        for (; r < bh; ++r) dst[r * stride + c] = left[max_base_y];
        break;
      }
    }
  }
}